

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

void __thiscall
chaiscript::exception::arithmetic_error::arithmetic_error(arithmetic_error *this,string *reason)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *reason_local;
  arithmetic_error *this_local;
  
  local_18 = reason;
  reason_local = (string *)this;
  std::operator+(&local_38,"Arithmetic error: ",reason);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__arithmetic_error_00825648;
  return;
}

Assistant:

explicit arithmetic_error(const std::string &reason)
        : std::runtime_error("Arithmetic error: " + reason) {
    }